

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# escape.c
# Opt level: O2

char * curl_easy_unescape(Curl_easy *data,char *string,int length,int *olen)

{
  CURLcode CVar1;
  int iVar2;
  char *str;
  size_t outputlen;
  
  str = (char *)0x0;
  if ((length < 0) ||
     (CVar1 = Curl_urldecode(string,(ulong)(uint)length,&str,&outputlen,REJECT_NADA),
     CVar1 != CURLE_OK)) {
    str = (char *)0x0;
  }
  else if (olen != (int *)0x0) {
    if (outputlen < 0x80000000) {
      iVar2 = curlx_uztosi(outputlen);
      *olen = iVar2;
    }
    else {
      (*Curl_cfree)(str);
      str = (char *)0x0;
    }
  }
  return str;
}

Assistant:

char *curl_easy_unescape(struct Curl_easy *data, const char *string,
                         int length, int *olen)
{
  char *str = NULL;
  (void)data;
  if(length >= 0) {
    size_t inputlen = (size_t)length;
    size_t outputlen;
    CURLcode res = Curl_urldecode(string, inputlen, &str, &outputlen,
                                  REJECT_NADA);
    if(res)
      return NULL;

    if(olen) {
      if(outputlen <= (size_t) INT_MAX)
        *olen = curlx_uztosi(outputlen);
      else
        /* too large to return in an int, fail! */
        Curl_safefree(str);
    }
  }
  return str;
}